

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void mi_heap_buf_print_count_bin
               (mi_heap_buf_t *hbuf,char *prefix,mi_stat_count_t *stat,size_t bin,_Bool add_comma)

{
  size_t sVar1;
  long lVar2;
  char *pcVar3;
  char buf [128];
  
  sVar1 = _mi_bin_size((size_t)stat);
  lVar2 = 0x10000;
  if (0x2000 < sVar1) {
    lVar2 = (ulong)(sVar1 < 0x10001) << 0x13;
  }
  pcVar3 = "";
  if ((int)bin != 0) {
    pcVar3 = ",";
  }
  _mi_snprintf(buf,0x80,
               "%s{ \"total\": %lld, \"peak\": %lld, \"current\": %lld, \"block_size\": %zu, \"page_size\": %zu }%s\n"
               ,"    ",*(undefined8 *)prefix,*(undefined8 *)(prefix + 8),
               *(undefined8 *)(prefix + 0x10),sVar1,lVar2,pcVar3);
  buf[0x7f] = '\0';
  mi_heap_buf_print(hbuf,buf);
  return;
}

Assistant:

static void mi_heap_buf_print_count_bin(mi_heap_buf_t* hbuf, const char* prefix, mi_stat_count_t* stat, size_t bin, bool add_comma) {
  const size_t binsize = _mi_bin_size(bin);
  const size_t pagesize = (binsize <= MI_SMALL_OBJ_SIZE_MAX ? MI_SMALL_PAGE_SIZE :
                            (binsize <= MI_MEDIUM_OBJ_SIZE_MAX ? MI_MEDIUM_PAGE_SIZE :
                              #if MI_LARGE_PAGE_SIZE
                              (binsize <= MI_LARGE_OBJ_SIZE_MAX ? MI_LARGE_PAGE_SIZE : 0)
                              #else
                              0
                              #endif
                              ));
  char buf[128];
  _mi_snprintf(buf, 128, "%s{ \"total\": %lld, \"peak\": %lld, \"current\": %lld, \"block_size\": %zu, \"page_size\": %zu }%s\n", prefix, stat->total, stat->peak, stat->current, binsize, pagesize, (add_comma ? "," : ""));
  buf[127] = 0;
  mi_heap_buf_print(hbuf, buf);
}